

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

rotation_t *
opengv::relative_pose::ge
          (RelativeAdapterBase *adapter,vector<int,_std::allocator<int>_> *indices,bool useWeights)

{
  geOutput_t *in_RDI;
  geOutput_t output;
  GeOutput *in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe2f;
  geOutput_t *indices_00;
  RelativeAdapterBase *in_stack_fffffffffffffe40;
  
  indices_00 = in_RDI;
  GeOutput::GeOutput(in_stack_fffffffffffffe08);
  ge(in_stack_fffffffffffffe40,(vector<int,_std::allocator<int>_> *)indices_00,in_RDI,
     (bool)in_stack_fffffffffffffe2f);
  return (rotation_t *)indices_00;
}

Assistant:

opengv::rotation_t
opengv::relative_pose::ge(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices,
    bool useWeights )
{
  geOutput_t output;
  //output.rotation = adapter.getR12(); //finding starting value using arun
  return ge(adapter,indices,output,useWeights);
}